

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseANDOperator,bool,false,true>
               (unsigned_long *ldata,unsigned_long *rdata,unsigned_long *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  unsigned_long rentry_1;
  unsigned_long rentry;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar7 = *rdata;
      iVar3 = 0;
      do {
        result_data[iVar3] = ldata[iVar3] & uVar7;
        iVar3 = iVar3 + 1;
      } while (count != iVar3);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar4 = 0;
    uVar7 = 0;
    do {
      uVar2 = puVar1[uVar4];
      uVar5 = uVar7 + 0x40;
      if (count <= uVar7 + 0x40) {
        uVar5 = count;
      }
      uVar6 = uVar5;
      if (uVar2 != 0) {
        uVar6 = uVar7;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar7 < uVar5) {
            uVar2 = *rdata;
            do {
              result_data[uVar7] = ldata[uVar7] & uVar2;
              uVar7 = uVar7 + 1;
              uVar6 = uVar5;
            } while (uVar5 != uVar7);
          }
        }
        else if (uVar7 < uVar5) {
          uVar8 = 0;
          do {
            if ((uVar2 >> (uVar8 & 0x3f) & 1) != 0) {
              result_data[uVar7 + uVar8] = *rdata & ldata[uVar7 + uVar8];
            }
            uVar8 = uVar8 + 1;
            uVar6 = uVar5;
          } while (uVar5 - uVar7 != uVar8);
        }
      }
      uVar4 = uVar4 + 1;
      uVar7 = uVar6;
    } while (uVar4 != count + 0x3f >> 6);
    return;
  }
  return;
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}